

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.h
# Opt level: O0

int __thiscall
TPZSFMatrix<long_double>::PutVal
          (TPZSFMatrix<long_double> *this,int64_t row,int64_t col,longdouble *value)

{
  unkbyte10 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t loccol;
  int64_t locrow;
  long local_30;
  long local_28;
  unkbyte10 *local_20;
  
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RCX;
  if (in_RSI < in_RDX) {
    TPZMatrix<long_double>::Swap(&local_28,&local_30);
  }
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(unkbyte10 *)
   (*(long *)(in_RDI + 0x20) + (((ulong)(local_28 * (local_28 + 1)) >> 1) + local_30) * 0x10) =
       *local_20;
  return 1;
}

Assistant:

inline int
TPZSFMatrix<TVar> ::PutVal(const int64_t row,const int64_t col,const TVar &value )
{
	int64_t locrow = row, loccol = col;
	if ( locrow < loccol )
		this->Swap( &locrow, &loccol );
	
	this->fDecomposed = 0;
	this->fElem[ ((locrow*(locrow+1)) >> 1) + loccol ] = value;
	return( 1 );
}